

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classification.hpp
# Opt level: O0

void __thiscall
boost::algorithm::detail::is_any_ofF<char>::is_any_ofF
          (is_any_ofF<char> *this,is_any_ofF<char> *Other)

{
  bool bVar1;
  void *pvVar2;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  set_value_type *DestStorage;
  set_value_type *SrcStorage;
  undefined8 *local_20;
  undefined8 *local_18;
  
  in_RDI[2] = in_RSI[2];
  *in_RDI = 0;
  bVar1 = use_fixed_storage(in_RDI[2]);
  local_20 = in_RDI;
  local_18 = in_RSI;
  if (!bVar1) {
    pvVar2 = operator_new__(in_RDI[2]);
    *in_RDI = pvVar2;
    local_20 = (undefined8 *)*in_RDI;
    local_18 = (undefined8 *)*in_RSI;
  }
  memcpy(local_20,local_18,in_RDI[2]);
  return;
}

Assistant:

is_any_ofF(const is_any_ofF& Other) : m_Size(Other.m_Size)
                {
                    // Prepare storage
                    m_Storage.m_dynSet=0;               
                    const set_value_type* SrcStorage=0;
                    set_value_type* DestStorage=0;

                    if(use_fixed_storage(m_Size))
                    {
                        // Use fixed storage
                        DestStorage=&m_Storage.m_fixSet[0];
                        SrcStorage=&Other.m_Storage.m_fixSet[0];
                    }
                    else
                    {
                        // Use dynamic storage
                        m_Storage.m_dynSet=new set_value_type[m_Size];
                        DestStorage=m_Storage.m_dynSet;
                        SrcStorage=Other.m_Storage.m_dynSet;
                    }

                    // Use fixed storage
                    ::std::memcpy(DestStorage, SrcStorage, sizeof(set_value_type)*m_Size);
                }